

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O3

size_t HUF_compress_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,uint maxSymbolValue,uint huffLog
                 ,HUF_nbStreams_e nbStreams,void *workSpace,size_t wkspSize,HUF_CElt *oldHufTable,
                 HUF_repeat *repeat,int flags)

{
  bool bVar1;
  HUF_repeat *pHVar2;
  uint *count;
  uint *workSpace_00;
  uint uVar3;
  HUF_repeat HVar4;
  uint *count_00;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  size_t _var_err__;
  BYTE *pBVar9;
  HUF_CElt *table;
  bool bVar10;
  bool bVar11;
  uint maxSymbolValueEnd;
  uint maxSymbolValueBegin;
  HUF_CElt *CTable;
  int in_stack_ffffffffffffff80;
  uint local_6c;
  BYTE *local_68;
  BYTE *local_60;
  uint *local_58;
  BYTE *local_50;
  uint local_44;
  uint *local_40;
  uint local_38;
  uint local_34;
  
  local_6c = maxSymbolValue;
  local_68 = (BYTE *)dst;
  local_60 = (BYTE *)src;
  count_00 = (uint *)HUF_alignUpWorkspace(workSpace,&wkspSize,8);
  pBVar9 = local_60;
  if (wkspSize < 0x1f08) {
    return 0xffffffffffffffbe;
  }
  if (dstSize == 0 || srcSize == 0) {
    return 0;
  }
  if (0x20000 < srcSize) {
    return 0xffffffffffffffb8;
  }
  if (0xc < huffLog) {
    return 0xffffffffffffffd4;
  }
  if (0xff < maxSymbolValue) {
    return 0xffffffffffffffd2;
  }
  if (maxSymbolValue == 0) {
    local_6c = 0xff;
    maxSymbolValue = 0xff;
  }
  local_50 = local_68 + dstSize;
  local_44 = 0xb;
  if (huffLog != 0) {
    local_44 = huffLog;
  }
  bVar10 = (flags & 4U) != 0;
  bVar11 = repeat != (HUF_repeat *)0x0;
  if ((bVar11 && bVar10) && (*repeat == HUF_repeat_valid)) {
    sVar5 = HUF_compressCTable_internal
                      (local_68,local_68,local_50,local_60,srcSize,nbStreams,oldHufTable,
                       in_stack_ffffffffffffff80);
    return sVar5;
  }
  if (0x9fff < srcSize && (flags & 8U) != 0) {
    local_34 = maxSymbolValue;
    uVar3 = HIST_count_simple(count_00,&local_34,local_60,0x1000);
    local_58 = (uint *)(ulong)uVar3;
    local_38 = local_6c;
    uVar3 = HIST_count_simple(count_00,&local_38,pBVar9 + (srcSize - 0x1000),0x1000);
    if ((ulong)uVar3 + (long)local_58 < 0x45) {
      return 0;
    }
  }
  pHVar2 = repeat;
  local_40 = count_00 + 0x302;
  local_58 = count_00;
  sVar5 = HIST_count_wksp(count_00,&local_6c,local_60,srcSize,local_40,0x1000);
  workSpace_00 = local_40;
  count = local_58;
  if (0xffffffffffffff88 < sVar5) {
    return sVar5;
  }
  if (sVar5 == srcSize) {
    *local_68 = *local_60;
    return 1;
  }
  if (sVar5 <= (srcSize >> 7) + 4) {
    return 0;
  }
  if (pHVar2 != (HUF_repeat *)0x0) {
    HVar4 = *pHVar2;
    if (HVar4 == HUF_repeat_check) {
      HVar4 = HUF_repeat_check;
      if (-1 < (int)local_6c) {
        lVar7 = 0;
        bVar1 = false;
        do {
          bVar1 = (bool)(bVar1 | ((char)oldHufTable[lVar7 + 1] == '\0' && local_58[lVar7] != 0));
          lVar7 = lVar7 + 1;
        } while ((ulong)local_6c + 1 != lVar7);
        if (bVar1) {
          *pHVar2 = HUF_repeat_none;
          goto LAB_007c04da;
        }
      }
    }
    pBVar9 = local_68;
    CTable = oldHufTable;
    if ((bVar11 && bVar10) && HVar4 != HUF_repeat_none) goto LAB_007c0682;
  }
LAB_007c04da:
  table = (HUF_CElt *)(count_00 + 0x100);
  in_stack_ffffffffffffff80 = flags;
  uVar3 = HUF_optimalTableLog(local_44,srcSize,local_6c,local_40,0x1300,table,local_58,flags);
  sVar5 = HUF_buildCTable_wksp(table,count,local_6c,uVar3,workSpace_00,0x1300);
  uVar3 = local_6c;
  if (0xffffffffffffff88 < sVar5) {
    return sVar5;
  }
  memset(table + (local_6c + 2),0,(ulong)(local_6c + 2) * -8 + 0x808);
  sVar5 = HUF_writeCTable_wksp(local_68,dstSize,table,uVar3,(uint)sVar5,workSpace_00,0x2ec);
  if (0xffffffffffffff88 < sVar5) {
    return sVar5;
  }
  if (repeat == (HUF_repeat *)0x0) {
    if (srcSize <= sVar5 + 0xc) {
      return 0;
    }
  }
  else {
    if (*repeat == HUF_repeat_none) {
      if (srcSize <= sVar5 + 0xc) {
        return 0;
      }
    }
    else {
      pBVar9 = local_68;
      CTable = oldHufTable;
      if ((int)local_6c < 0) goto LAB_007c0682;
      lVar7 = 0;
      uVar6 = 0;
      do {
        uVar6 = uVar6 + (ulong)local_58[lVar7] * (ulong)(byte)oldHufTable[lVar7 + 1];
        lVar7 = lVar7 + 1;
      } while ((ulong)local_6c + 1 != lVar7);
      lVar7 = 0;
      uVar8 = 0;
      do {
        uVar8 = uVar8 + (ulong)local_58[lVar7] * (ulong)(byte)local_58[lVar7 * 2 + 0x102];
        lVar7 = lVar7 + 1;
      } while ((ulong)local_6c + 1 != lVar7);
      if ((srcSize <= sVar5 + 0xc) || (uVar6 >> 3 <= (uVar8 >> 3) + sVar5)) goto LAB_007c0682;
    }
    *repeat = HUF_repeat_none;
  }
  pBVar9 = local_68 + sVar5;
  CTable = table;
  if (oldHufTable != (HUF_CElt *)0x0) {
    memcpy(oldHufTable,table,0x808);
  }
LAB_007c0682:
  sVar5 = HUF_compressCTable_internal
                    (local_68,pBVar9,local_50,local_60,srcSize,nbStreams,CTable,
                     in_stack_ffffffffffffff80);
  return sVar5;
}

Assistant:

static size_t
HUF_compress_internal (void* dst, size_t dstSize,
                 const void* src, size_t srcSize,
                       unsigned maxSymbolValue, unsigned huffLog,
                       HUF_nbStreams_e nbStreams,
                       void* workSpace, size_t wkspSize,
                       HUF_CElt* oldHufTable, HUF_repeat* repeat, int flags)
{
    HUF_compress_tables_t* const table = (HUF_compress_tables_t*)HUF_alignUpWorkspace(workSpace, &wkspSize, ZSTD_ALIGNOF(size_t));
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;

    DEBUGLOG(5, "HUF_compress_internal (srcSize=%zu)", srcSize);
    HUF_STATIC_ASSERT(sizeof(*table) + HUF_WORKSPACE_MAX_ALIGNMENT <= HUF_WORKSPACE_SIZE);

    /* checks & inits */
    if (wkspSize < sizeof(*table)) return ERROR(workSpace_tooSmall);
    if (!srcSize) return 0;  /* Uncompressed */
    if (!dstSize) return 0;  /* cannot fit anything within dst budget */
    if (srcSize > HUF_BLOCKSIZE_MAX) return ERROR(srcSize_wrong);   /* current block size limit */
    if (huffLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);
    if (!maxSymbolValue) maxSymbolValue = HUF_SYMBOLVALUE_MAX;
    if (!huffLog) huffLog = HUF_TABLELOG_DEFAULT;

    /* Heuristic : If old table is valid, use it for small inputs */
    if ((flags & HUF_flags_preferRepeat) && repeat && *repeat == HUF_repeat_valid) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, flags);
    }

    /* If uncompressible data is suspected, do a smaller sampling first */
    DEBUG_STATIC_ASSERT(SUSPECT_INCOMPRESSIBLE_SAMPLE_RATIO >= 2);
    if ((flags & HUF_flags_suspectUncompressible) && srcSize >= (SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE * SUSPECT_INCOMPRESSIBLE_SAMPLE_RATIO)) {
        size_t largestTotal = 0;
        DEBUGLOG(5, "input suspected incompressible : sampling to check");
        {   unsigned maxSymbolValueBegin = maxSymbolValue;
            CHECK_V_F(largestBegin, HIST_count_simple (table->count, &maxSymbolValueBegin, (const BYTE*)src, SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) );
            largestTotal += largestBegin;
        }
        {   unsigned maxSymbolValueEnd = maxSymbolValue;
            CHECK_V_F(largestEnd, HIST_count_simple (table->count, &maxSymbolValueEnd, (const BYTE*)src + srcSize - SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE, SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) );
            largestTotal += largestEnd;
        }
        if (largestTotal <= ((2 * SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) >> 7)+4) return 0;   /* heuristic : probably not compressible enough */
    }

    /* Scan input and build symbol stats */
    {   CHECK_V_F(largest, HIST_count_wksp (table->count, &maxSymbolValue, (const BYTE*)src, srcSize, table->wksps.hist_wksp, sizeof(table->wksps.hist_wksp)) );
        if (largest == srcSize) { *ostart = ((const BYTE*)src)[0]; return 1; }   /* single symbol, rle */
        if (largest <= (srcSize >> 7)+4) return 0;   /* heuristic : probably not compressible enough */
    }
    DEBUGLOG(6, "histogram detail completed (%zu symbols)", showU32(table->count, maxSymbolValue+1));

    /* Check validity of previous table */
    if ( repeat
      && *repeat == HUF_repeat_check
      && !HUF_validateCTable(oldHufTable, table->count, maxSymbolValue)) {
        *repeat = HUF_repeat_none;
    }
    /* Heuristic : use existing table for small inputs */
    if ((flags & HUF_flags_preferRepeat) && repeat && *repeat != HUF_repeat_none) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, flags);
    }

    /* Build Huffman Tree */
    huffLog = HUF_optimalTableLog(huffLog, srcSize, maxSymbolValue, &table->wksps, sizeof(table->wksps), table->CTable, table->count, flags);
    {   size_t const maxBits = HUF_buildCTable_wksp(table->CTable, table->count,
                                            maxSymbolValue, huffLog,
                                            &table->wksps.buildCTable_wksp, sizeof(table->wksps.buildCTable_wksp));
        CHECK_F(maxBits);
        huffLog = (U32)maxBits;
        DEBUGLOG(6, "bit distribution completed (%zu symbols)", showCTableBits(table->CTable + 1, maxSymbolValue+1));
    }
    /* Zero unused symbols in CTable, so we can check it for validity */
    {
        size_t const ctableSize = HUF_CTABLE_SIZE_ST(maxSymbolValue);
        size_t const unusedSize = sizeof(table->CTable) - ctableSize * sizeof(HUF_CElt);
        ZSTD_memset(table->CTable + ctableSize, 0, unusedSize);
    }

    /* Write table description header */
    {   CHECK_V_F(hSize, HUF_writeCTable_wksp(op, dstSize, table->CTable, maxSymbolValue, huffLog,
                                              &table->wksps.writeCTable_wksp, sizeof(table->wksps.writeCTable_wksp)) );
        /* Check if using previous huffman table is beneficial */
        if (repeat && *repeat != HUF_repeat_none) {
            size_t const oldSize = HUF_estimateCompressedSize(oldHufTable, table->count, maxSymbolValue);
            size_t const newSize = HUF_estimateCompressedSize(table->CTable, table->count, maxSymbolValue);
            if (oldSize <= hSize + newSize || hSize + 12 >= srcSize) {
                return HUF_compressCTable_internal(ostart, op, oend,
                                                   src, srcSize,
                                                   nbStreams, oldHufTable, flags);
        }   }

        /* Use the new huffman table */
        if (hSize + 12ul >= srcSize) { return 0; }
        op += hSize;
        if (repeat) { *repeat = HUF_repeat_none; }
        if (oldHufTable)
            ZSTD_memcpy(oldHufTable, table->CTable, sizeof(table->CTable));  /* Save new table */
    }
    return HUF_compressCTable_internal(ostart, op, oend,
                                       src, srcSize,
                                       nbStreams, table->CTable, flags);
}